

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  ushort uVar6;
  ulong uVar7;
  socklen_t addr_size;
  sockaddr_in addr;
  uint local_58;
  socklen_t local_54;
  thread local_50;
  _func_void_int *local_48;
  undefined1 local_40 [4];
  in_addr_t local_3c;
  char local_38 [8];
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    pcVar3 = "Erro ao criar socket";
  }
  else {
    uVar6 = 0x15e0;
    if (0 < argc) {
      uVar7 = 0;
      do {
        iVar2 = strcmp(argv[uVar7],"--port");
        if (iVar2 == 0) {
          iVar2 = atoi(argv[uVar7 + 1]);
          uVar6 = (ushort)iVar2;
          printf("porta: %d\n",(ulong)(uint)(int)(short)uVar6);
          break;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)argc != uVar7);
    }
    local_40._2_2_ = uVar6 << 8 | uVar6 >> 8;
    local_40._0_2_ = 2;
    local_3c = 0;
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    iVar2 = bind(__fd,(sockaddr *)local_40,0x10);
    if (iVar2 == -1) {
      pcVar3 = "Erro na funcao bind()";
    }
    else {
      iVar2 = listen(__fd,1);
      if (iVar2 == -1) {
        puts("Erro na funcao listen()");
        return 1;
      }
      local_58 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
      if (local_58 != 0xffffffff) {
        do {
          local_54 = 0x10;
          getpeername(local_58,(sockaddr *)local_40,&local_54);
          uVar1 = local_58;
          pcVar3 = inet_ntoa((in_addr)local_3c);
          printf("\x1b[94mClient connected\x1b[0m: %d (%s)\n",(ulong)uVar1,pcVar3);
          sVar4 = recv(local_58,names + (int)local_58,1000,0);
          if ((int)sVar4 + 1U < 2) {
            close(local_58);
          }
          else {
            names[(int)local_58][(int)sVar4] = '\0';
            iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutsocks);
            if (iVar2 != 0) {
              uVar5 = std::__throw_system_error(iVar2);
              if (local_50._M_id._M_thread == 0) {
                _Unwind_Resume(uVar5);
              }
LAB_00102ae7:
              std::terminate();
            }
            if (socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&socks,
                         (iterator)
                         socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_58);
            }
            else {
              *socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish = local_58;
              socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = socks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
            pthread_mutex_unlock((pthread_mutex_t *)&mutsocks);
            send_thread();
            local_48 = rcv_thread;
            std::thread::thread<void(*)(int),int&,void>(&local_50,&local_48,(int *)&local_58);
            std::thread::detach();
            if (local_50._M_id._M_thread != 0) goto LAB_00102ae7;
          }
          local_58 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
        } while (local_58 != 0xffffffff);
      }
      pcVar3 = "Erro na funcao accept()";
    }
  }
  perror(pcVar3);
  return 1;
}

Assistant:

int main(int argc, char **argv) {

  std::thread tsend;
  int sockfd, sock_client;
  unsigned int port;
  struct sockaddr_in addr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  if(sockfd == -1) {
    perror("Erro ao criar socket");
    return 1;
  }
  port = 5600;
  for (int i = 0; i < argc; i++) {
    if(strcmp(argv[i],"--port") == 0) {
      port = (short)atoi(argv[i+1]);
      printf("porta: %d\n", port);
      break;
    }
  }



  addr.sin_family = AF_INET;
  addr.sin_port   = htons(port);
  addr.sin_addr.s_addr = INADDR_ANY;

  memset(&addr.sin_zero,0,sizeof(addr.sin_zero));

  if(bind(sockfd,(struct sockaddr*)&addr,sizeof(addr)) == -1) {
    perror("Erro na funcao bind()");
    return 1;
  }
  if(listen(sockfd,1) == -1) {
    printf("Erro na funcao listen()\n");
    return 1;
  }

  while(1) {
    sock_client = accept(sockfd,0,0);
    if(sock_client == -1) {
      perror("Erro na funcao accept()");
      return 1;
    }
    else {
      // Get client info
      socklen_t addr_size = sizeof(struct sockaddr_in);
      int res = getpeername(sock_client, (struct sockaddr*)&addr, &addr_size);
      printf("\033[94mClient connected\033[0m: %d (%s)\n", sock_client, inet_ntoa(addr.sin_addr));
      int mlen = recv(sock_client, names[sock_client], MSG_LEN,0);
      if(mlen == -1 || mlen == 0) {
        close(sock_client);
      }
      else {
        names[sock_client][mlen]='\0';
        mutsocks.lock();
        socks.push_back(sock_client);
        mutsocks.unlock();
        send_thread();
        std::thread(&rcv_thread,sock_client).detach();
      }
    }
  }

  tsend.join();
  for(int i = 0; i < socks.size(); i++) {
    close(socks[i]);
  }

  close(sockfd);
  return 0;
}